

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O1

void __thiscall player_t::player_t(player_t *this)

{
  this->mo = (APlayerPawn *)0x0;
  this->playerstate = '\0';
  (this->userinfo).super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>.
  NumUsed = 0;
  TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>::SetNodeVector
            (&(this->userinfo).
              super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>,1);
  this->morphTics = 0;
  this->MorphedPlayerClass = (PClassPlayerPawn *)0x0;
  this->MorphStyle = 0;
  this->cls = (PClassPlayerPawn *)0x0;
  this->DesiredFOV = 0.0;
  this->FOV = 0.0;
  this->viewz = 0.0;
  this->viewheight = 0.0;
  this->deltaviewheight = 0.0;
  this->bob = 0.0;
  (this->Vel).X = 0.0;
  (this->Vel).Y = 0.0;
  this->centering = false;
  this->turnticks = '\0';
  this->attackdown = false;
  this->usedown = false;
  this->oldbuttons = 0;
  this->health = 0;
  this->inventorytics = 0;
  this->CurrentPlayerClass = '\0';
  this->fragcount = 0;
  this->lastkilltime = 0;
  *(undefined8 *)&this->multicount = 0;
  *(undefined8 *)((long)&this->ReadyWeapon + 4) = 0;
  *(undefined8 *)((long)&this->PendingWeapon + 4) = 0;
  *(undefined8 *)((long)&(this->psprites).field_0 + 4) = 0;
  this->timefreezer = 0;
  this->refire = 0;
  this->inconsistant = 0;
  this->killcount = 0;
  this->itemcount = 0;
  this->secretcount = 0;
  this->damagecount = 0;
  this->bonuscount = 0;
  this->hazardcount = 0;
  this->hazardtype = 0;
  this->poisoncount = 0;
  this->poisontype = 0;
  this->poisonpaintype = 0;
  (this->poisoner).field_0.p = (AActor *)0x0;
  (this->attacker).field_0.p = (AActor *)0x0;
  this->extralight = 0;
  *(undefined8 *)((long)&(this->PremorphWeapon).field_0 + 1) = 0;
  *(undefined8 *)((long)&this->chickenPeck + 1) = 0;
  this->MorphExitFlash = (PClassActor *)0x0;
  (this->PremorphWeapon).field_0.p = (AWeapon *)0x0;
  this->air_finished = 0;
  this->LastDamageType = 0;
  (this->MUSINFOactor).field_0.p = (AActor *)0x0;
  *(undefined8 *)&this->respawn_time = 0;
  *(undefined8 *)((long)&(this->camera).field_0 + 4) = 0;
  this->MUSINFOtics = -1;
  this->crouching = '\0';
  this->crouchdir = '\0';
  this->BlendB = 0.0;
  this->BlendA = 0.0;
  (this->Bot).field_0.p = (DBot *)0x0;
  this->BlendR = 0.0;
  this->BlendG = 0.0;
  (this->LogText).Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  this->crouchviewdelta = 0.0;
  this->crouchfactor = 0.0;
  this->crouchoffset = 0.0;
  FWeaponSlots::FWeaponSlots(&this->weapons);
  (this->cmd).ucmd.buttons = 0;
  (this->cmd).ucmd.pitch = 0;
  (this->cmd).ucmd.yaw = 0;
  (this->cmd).ucmd.roll = 0;
  (this->cmd).ucmd.forwardmove = 0;
  (this->cmd).ucmd.sidemove = 0;
  (this->cmd).ucmd.upmove = 0;
  *(undefined4 *)&(this->cmd).consistancy = 0;
  this->frags[0] = 0;
  this->frags[1] = 0;
  this->frags[2] = 0;
  this->frags[3] = 0;
  this->frags[4] = 0;
  this->frags[5] = 0;
  this->frags[6] = 0;
  this->frags[7] = 0;
  (this->ConversationNPC).field_0.p = (AActor *)0x0;
  (this->ConversationPC).field_0.p = (AActor *)0x0;
  *(undefined8 *)((long)&(this->ConversationPC).field_0 + 1) = 0;
  *(undefined8 *)((long)&(this->ConversationNPCAngle).Degrees + 1) = 0;
  return;
}

Assistant:

player_t::player_t()
: mo(0),
  playerstate(0),
  cls(0),
  DesiredFOV(0),
  FOV(0),
  viewz(0),
  viewheight(0),
  deltaviewheight(0),
  bob(0),
  Vel(0, 0),
  centering(0),
  turnticks(0),
  attackdown(0),
  usedown(0),
  oldbuttons(0),
  health(0),
  inventorytics(0),
  CurrentPlayerClass(0),
  fragcount(0),
  lastkilltime(0),
  multicount(0),
  spreecount(0),
  WeaponState(0),
  ReadyWeapon(0),
  PendingWeapon(0),
  psprites(0),
  cheats(0),
  timefreezer(0),
  refire(0),
  inconsistant(0),
  killcount(0),
  itemcount(0),
  secretcount(0),
  damagecount(0),
  bonuscount(0),
  hazardcount(0),
  poisoncount(0),
  poisoner(0),
  attacker(0),
  extralight(0),
  morphTics(0),
  MorphedPlayerClass(0),
  MorphStyle(0),
  MorphExitFlash(0),
  PremorphWeapon(0),
  chickenPeck(0),
  jumpTics(0),
  onground(0),
  respawn_time(0),
  camera(0),
  air_finished(0),
  MUSINFOactor(0),
  MUSINFOtics(-1),
  crouching(0),
  crouchdir(0),
  Bot(0),
  BlendR(0),
  BlendG(0),
  BlendB(0),
  BlendA(0),
  LogText(),
  crouchfactor(0),
  crouchoffset(0),
  crouchviewdelta(0),
  ConversationNPC(0),
  ConversationPC(0),
  ConversationNPCAngle(0.),
  ConversationFaceTalker(0)
{
	memset (&cmd, 0, sizeof(cmd));
	memset (frags, 0, sizeof(frags));
}